

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xpath_derived_from_or_self
              (lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
              lyxp_set *set,int options)

{
  byte bVar1;
  lyxp_set_type lVar2;
  lyd_node *plVar3;
  lys_node *plVar4;
  char *ident_str;
  lys_ident **pplVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  lyxp_set *plVar9;
  ushort uVar10;
  undefined8 uVar11;
  ulong uVar12;
  
  lVar2 = (*args)->type;
  if ((ulong)lVar2 < 2) {
    iVar7 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
    iVar8 = -1;
    if (iVar7 == 0) {
      iVar8 = 0;
      set_fill_boolean(set,0);
      if (((*args)->type != LYXP_SET_EMPTY) && (plVar9 = *args, plVar9->used != 0)) {
        uVar10 = 0;
        do {
          plVar3 = (plVar9->val).nodes[uVar10].node;
          plVar4 = plVar3->schema;
          if (((plVar4->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
             (iVar8._0_2_ = plVar4[1].flags, iVar8._2_1_ = plVar4[1].ext_size,
             iVar8._3_1_ = plVar4[1].iffeature_size, iVar8 == 7)) {
            plVar4 = plVar3[1].schema;
            ident_str = (args[1]->val).str;
            iVar8 = xpath_derived_from_ident_cmp((lys_ident *)plVar4,ident_str);
            if (iVar8 == 0) {
              set_fill_boolean(set,1);
              break;
            }
            bVar1 = plVar4->padding[3];
            if (bVar1 == 0) {
              uVar6 = 0;
            }
            else {
              pplVar5 = *(lys_ident ***)&plVar4->nodetype;
              uVar6 = (ushort)bVar1;
              uVar12 = 0;
              do {
                iVar8 = xpath_derived_from_ident_cmp(pplVar5[uVar12],ident_str);
                if (iVar8 == 0) {
                  set_fill_boolean(set,1);
                  uVar6 = (ushort)uVar12;
                  break;
                }
                uVar12 = uVar12 + 1;
              } while (bVar1 != uVar12);
            }
            if (uVar6 < (plVar3[1].schema)->padding[3]) {
              return 0;
            }
          }
          uVar10 = uVar10 + 1;
          plVar9 = *args;
        } while ((uint)uVar10 < plVar9->used);
        iVar8 = 0;
      }
    }
  }
  else {
    if (lVar2 < (LYXP_SET_NUMBER|LYXP_SET_SNODE_SET)) {
      uVar11 = *(undefined8 *)(&DAT_001afd20 + (ulong)lVar2 * 8);
    }
    else {
      uVar11 = 0;
    }
    ly_vlog(LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,uVar11,
            "derived-from-or-self(node-set, string)");
    iVar8 = -1;
  }
  return iVar8;
}

Assistant:

static int
xpath_derived_from_or_self(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node,
                           struct lys_module *local_mod, struct lyxp_set *set, int options)
{
    uint16_t i, j;
    struct lyd_node_leaf_list *leaf;
    struct lys_node_leaf *sleaf;

    if ((args[0]->type != LYXP_SET_NODE_SET) && (args[0]->type != LYXP_SET_EMPTY)) {
        LOGVAL(LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "derived-from-or-self(node-set, string)");
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    set_fill_boolean(set, 0);
    if (args[0]->type != LYXP_SET_EMPTY) {
        for (i = 0; i < args[0]->used; ++i) {
            leaf = (struct lyd_node_leaf_list *)args[0]->val.nodes[i].node;
            sleaf = (struct lys_node_leaf *)leaf->schema;
            if ((sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && (sleaf->type.base == LY_TYPE_IDENT)) {
                if (!xpath_derived_from_ident_cmp(leaf->value.ident, args[1]->val.str)) {
                    set_fill_boolean(set, 1);
                    break;
                }

                for (j = 0; j < leaf->value.ident->base_size; ++j) {
                    if (!xpath_derived_from_ident_cmp(leaf->value.ident->base[j], args[1]->val.str)) {
                        set_fill_boolean(set, 1);
                        break;
                    }
                }

                if (j < leaf->value.ident->base_size) {
                    break;
                }
            }
        }
    }

    return EXIT_SUCCESS;
}